

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool BaseMap_Open(TFileStream *pStream,TCHAR *szFileName,DWORD dwStreamFlags)

{
  bool bVar1;
  int __fd;
  int iVar2;
  void *pvVar3;
  DWORD *pDVar4;
  undefined4 in_register_00000014;
  stat64 fileinfo;
  stat64 local_b0;
  
  __fd = open(szFileName,0,CONCAT44(in_register_00000014,dwStreamFlags));
  if (__fd == -1) {
    bVar1 = true;
  }
  else {
    iVar2 = fstat64(__fd,&local_b0);
    bVar1 = true;
    if (iVar2 != -1) {
      pvVar3 = mmap((void *)0x0,local_b0.st_size,1,2,__fd,0);
      (pStream->Base).File.hFile = pvVar3;
      if (pvVar3 != (void *)0x0) {
        (pStream->Base).File.FileTime = local_b0.st_mtim.tv_sec * 10000000 + 0x19db1ded53e8000;
        (pStream->Base).File.FileSize = local_b0.st_size;
        (pStream->Base).File.FilePos = 0;
        bVar1 = false;
      }
    }
    close(__fd);
  }
  if (bVar1) {
    pDVar4 = (DWORD *)__errno_location();
    SetLastError(*pDVar4);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

static bool BaseMap_Open(TFileStream * pStream, const TCHAR * szFileName, DWORD dwStreamFlags)
{
#ifdef PLATFORM_WINDOWS

    ULARGE_INTEGER FileSize;
    HANDLE hFile;
    HANDLE hMap;
    bool bResult = false;

    // Keep compiler happy
    dwStreamFlags = dwStreamFlags;

    // Open the file for read access
    hFile = CreateFile(szFileName, FILE_READ_DATA, FILE_SHARE_READ, NULL, OPEN_EXISTING, 0, NULL);
    if(hFile != INVALID_HANDLE_VALUE)
    {
        // Retrieve file size. Don't allow mapping file of a zero size.
        FileSize.LowPart = GetFileSize(hFile, &FileSize.HighPart);
        if(FileSize.QuadPart != 0)
        {
            // Now create mapping object
            hMap = CreateFileMapping(hFile, NULL, PAGE_READONLY, 0, 0, NULL);
            if(hMap != NULL)
            {
                // Map the entire view into memory
                // Note that this operation will fail if the file can't fit
                // into usermode address space
                pStream->Base.Map.pbFile = (LPBYTE)MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);
                if(pStream->Base.Map.pbFile != NULL)
                {
                    // Retrieve file time
                    GetFileTime(hFile, NULL, NULL, (LPFILETIME)&pStream->Base.Map.FileTime);

                    // Retrieve file size and position
                    pStream->Base.Map.FileSize = FileSize.QuadPart;
                    pStream->Base.Map.FilePos = 0;
                    bResult = true;
                }

                // Close the map handle
                CloseHandle(hMap);
            }
        }

        // Close the file handle
        CloseHandle(hFile);
    }

    // If the file is not there and is not available for random access,
    // report error
    if(bResult == false)
        return false;
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    struct stat64 fileinfo;
    intptr_t handle;
    bool bResult = false;

    // Open the file
    handle = open(szFileName, O_RDONLY);
    if(handle != -1)
    {
        // Get the file size
        if(fstat64(handle, &fileinfo) != -1)
        {
            pStream->Base.Map.pbFile = (LPBYTE)mmap(NULL, (size_t)fileinfo.st_size, PROT_READ, MAP_PRIVATE, handle, 0);
            if(pStream->Base.Map.pbFile != NULL)
            {
                // time_t is number of seconds since 1.1.1970, UTC.
                // 1 second = 10000000 (decimal) in FILETIME
                // Set the start to 1.1.1970 00:00:00
                pStream->Base.Map.FileTime = 0x019DB1DED53E8000ULL + (10000000 * fileinfo.st_mtime);
                pStream->Base.Map.FileSize = (ULONGLONG)fileinfo.st_size;
                pStream->Base.Map.FilePos = 0;
                bResult = true;
            }
        }
        close(handle);
    }

    // Did the mapping fail?
    if(bResult == false)
    {
        SetLastError(errno);
        return false;
    }
#endif

    return true;
}